

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal(void *this,int start,uint num,long elements)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < (int)num) {
    if (elements != 0) {
      for (uVar4 = 0; num != uVar4; uVar4 = uVar4 + 1) {
        *(undefined8 *)(elements + uVar4 * 8) =
             *(undefined8 *)(*(long *)((long)this + 0x10) + (long)start * 8 + 8 + uVar4 * 8);
      }
    }
    piVar2 = *(int **)((long)this + 0x10);
    if (piVar2 != (int *)0x0) {
      for (lVar3 = (long)(int)(start + num); iVar1 = *piVar2, lVar3 < iVar1; lVar3 = lVar3 + 1) {
        *(undefined8 *)(piVar2 + lVar3 * 2 + (long)(int)num * -2 + 2) =
             *(undefined8 *)(piVar2 + lVar3 * 2 + 2);
        piVar2 = *(int **)((long)this + 0x10);
      }
      *(int *)((long)this + 8) = *(int *)((long)this + 8) - num;
      *piVar2 = iVar1 - num;
    }
    return;
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::false_type) {
  // This case is identical to UnsafeArenaExtractSubrange(). However, since
  // ExtractSubrange() must return heap-allocated objects by contract, and we
  // cannot fulfill this contract if we are an on arena, we must GOOGLE_DCHECK() that
  // we are not on an arena.
  GOOGLE_DCHECK(GetArenaNoVirtual() == NULL)
      << "ExtractSubrange() when arena is non-NULL is only supported when "
      << "the Element type supplies a MergeFrom() operation to make copies.";
  UnsafeArenaExtractSubrange(start, num, elements);
}